

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Msg.cpp
# Opt level: O0

void __thiscall util::logging::Msg::Msg(Msg *this,string *txt,M_Level lvl)

{
  M_Level lvl_local;
  string *txt_local;
  Msg *this_local;
  
  this->_vptr_Msg = (_func_int **)&PTR__Msg_00147b20;
  std::__cxx11::string::string((string *)&this->msg_txt,(string *)txt);
  this->msg_lvl = lvl;
  return;
}

Assistant:

Msg::Msg( const std::string & txt, M_Level lvl ) :
			msg_txt(txt), msg_lvl(lvl)
		{
		}